

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParserTest.cpp
# Opt level: O2

void __thiscall InputInterfaceToStream::~InputInterfaceToStream(InputInterfaceToStream *this)

{
  ~InputInterfaceToStream(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

virtual ~InputInterfaceToStream(){}